

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

string * testing::internal::JsonUnitTestResultPrinter::TestPropertiesAsJson
                   (string *__return_storage_ptr__,TestResult *result,string *indent)

{
  int iVar1;
  int iVar2;
  Message *pMVar3;
  char *pcVar4;
  allocator local_91;
  string local_90;
  string local_70;
  char *local_50 [3];
  TestProperty *local_38;
  TestProperty *property;
  int i;
  Message attributes;
  string *indent_local;
  TestResult *result_local;
  
  attributes.ss_.ptr_ =
       (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )(scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )indent;
  Message::Message((Message *)&stack0xffffffffffffffd8);
  property._4_4_ = 0;
  while( true ) {
    iVar1 = property._4_4_;
    iVar2 = TestResult::test_property_count(result);
    if (iVar2 <= iVar1) break;
    local_38 = TestResult::GetTestProperty(result,property._4_4_);
    pMVar3 = Message::operator<<((Message *)&stack0xffffffffffffffd8,(char (*) [3])0x195a06);
    pMVar3 = Message::operator<<(pMVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)attributes.ss_.ptr_);
    pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x195a03);
    local_50[0] = TestProperty::key(local_38);
    pMVar3 = Message::operator<<(pMVar3,local_50);
    pMVar3 = Message::operator<<(pMVar3,(char (*) [4])"\": ");
    pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x195a03);
    pcVar4 = TestProperty::value(local_38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,pcVar4,&local_91);
    EscapeJson(&local_70,&local_90);
    pMVar3 = Message::operator<<(pMVar3,&local_70);
    Message::operator<<(pMVar3,(char (*) [2])0x195a03);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    property._4_4_ = property._4_4_ + 1;
  }
  Message::GetString_abi_cxx11_(__return_storage_ptr__,(Message *)&stack0xffffffffffffffd8);
  Message::~Message((Message *)&stack0xffffffffffffffd8);
  return __return_storage_ptr__;
}

Assistant:

std::string JsonUnitTestResultPrinter::TestPropertiesAsJson(
    const TestResult& result, const std::string& indent) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << ",\n" << indent << "\"" << property.key() << "\": "
               << "\"" << EscapeJson(property.value()) << "\"";
  }
  return attributes.GetString();
}